

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEsop.c
# Opt level: O2

void Eso_ManCoverPrint(Eso_Man_t *p,Vec_Int_t *vEsop)

{
  uint nCapMin;
  int iVar1;
  int iVar2;
  int i;
  Vec_Str_t *p_00;
  char *pcVar3;
  Vec_Int_t *p_01;
  int i_00;
  ulong uVar4;
  ulong uVar5;
  
  if (vEsop->nSize == 0) {
    puts("Const 0");
    return;
  }
  nCapMin = p->nVars;
  p_00 = (Vec_Str_t *)malloc(0x10);
  iVar1 = 0x10;
  if (0xe < nCapMin + 3) {
    iVar1 = nCapMin + 4;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar1;
  uVar4 = 0;
  if (iVar1 == 0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = (char *)malloc((long)iVar1);
  }
  p_00->pArray = pcVar3;
  Vec_StrGrow(p_00,nCapMin);
  p_00->nSize = nCapMin;
  uVar5 = (ulong)nCapMin;
  if ((int)nCapMin < 1) {
    uVar5 = 0;
  }
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    p_00->pArray[uVar4] = '-';
  }
  Vec_StrPush(p_00,' ');
  Vec_StrPush(p_00,'1');
  Vec_StrPush(p_00,'\n');
  Vec_StrPush(p_00,'\0');
  iVar1 = vEsop->nSize;
  if (0 < iVar1) {
    for (i_00 = 0; i_00 < iVar1; i_00 = i_00 + 1) {
      iVar1 = Vec_IntEntry(vEsop,i_00);
      if (iVar1 == p->Cube1) {
        printf("%s",p_00->pArray);
      }
      else {
        p_01 = Eso_ManCube(p,iVar1);
        for (iVar1 = 0; iVar1 < p_01->nSize; iVar1 = iVar1 + 1) {
          iVar2 = Vec_IntEntry(p_01,iVar1);
          i = Abc_Lit2Var(iVar2);
          iVar2 = Abc_LitIsCompl(iVar2);
          Vec_StrWriteEntry(p_00,i,(iVar2 == 0) + '0');
        }
        printf("%s",p_00->pArray);
        for (iVar1 = 0; iVar1 < p_01->nSize; iVar1 = iVar1 + 1) {
          iVar2 = Vec_IntEntry(p_01,iVar1);
          iVar2 = Abc_Lit2Var(iVar2);
          Vec_StrWriteEntry(p_00,iVar2,'-');
        }
      }
      iVar1 = vEsop->nSize;
    }
    putchar(10);
    free(p_00->pArray);
    free(p_00);
    return;
  }
  __assert_fail("Vec_IntSize(vEsop) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEsop.c"
                ,0x80,"void Eso_ManCoverPrint(Eso_Man_t *, Vec_Int_t *)");
}

Assistant:

void Eso_ManCoverPrint( Eso_Man_t * p, Vec_Int_t * vEsop )
{
    Vec_Str_t * vStr;
    Vec_Int_t * vCube;
    int i, k, Lit, Cube;
    if ( Vec_IntSize(vEsop) == 0 )
    {
        printf( "Const 0\n" );
        return;
    }
    vStr = Vec_StrAlloc( p->nVars + 4 );
    Vec_StrFill( vStr, p->nVars, '-' );
    Vec_StrPush( vStr, ' ' );
    Vec_StrPush( vStr, '1' );
    Vec_StrPush( vStr, '\n' );
    Vec_StrPush( vStr, '\0' );
    assert( Vec_IntSize(vEsop) > 0 );
    Vec_IntForEachEntry( vEsop, Cube, i )
    {
        if ( Cube == p->Cube1 )
            printf( "%s", Vec_StrArray(vStr) );
        else 
        {
            vCube = Eso_ManCube( p, Cube );
            Vec_IntForEachEntry( vCube, Lit, k )
                Vec_StrWriteEntry( vStr, Abc_Lit2Var(Lit), (char)(Abc_LitIsCompl(Lit)?'0':'1') );
            printf( "%s", Vec_StrArray(vStr) );
            Vec_IntForEachEntry( vCube, Lit, k )
                Vec_StrWriteEntry( vStr, Abc_Lit2Var(Lit), '-' );
        }
    }
    printf( "\n" );
    Vec_StrFree( vStr );
}